

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O0

void __thiscall
webfront::log::debug<unsigned_long>::debug
          (debug<unsigned_long> *this,string_view fmt,unsigned_long *ts,srcLoc *l)

{
  bool bVar1;
  undefined1 in_stack_00000038 [16];
  
  bVar1 = anon_unknown_4::is('\x04');
  if (bVar1) {
    anon_unknown_4::log<unsigned_long>
              (fmt._M_str._7_1_,(string_view)in_stack_00000038,(srcLoc *)fmt._M_len,
               (unsigned_long *)this);
  }
  return;
}

Assistant:

debug(string_view fmt, Ts&&... ts, const srcLoc& l = srcLoc::current()) {
    if (is(Debug)) log(Debug, fmt, l, std::forward<Ts>(ts)...);
    }